

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
quantileloss::first_derivative(quantileloss *this,shared_data *param_1,float prediction,float label)

{
  float fVar1;
  float local_34;
  float e;
  float label_local;
  float prediction_local;
  shared_data *param_1_local;
  quantileloss *this_local;
  float local_4;
  
  fVar1 = label - prediction;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (fVar1 <= 0.0) {
      local_34 = 1.0 - this->tau;
    }
    else {
      local_34 = -this->tau;
    }
    local_4 = local_34;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float first_derivative(shared_data*, float prediction, float label)
  {
    float e = label - prediction;
    if (e == 0)
      return 0;
    return e > 0 ? -tau : (1 - tau);
  }